

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_matrix.c
# Opt level: O2

REF_STATUS ref_matrix_show_jacob(REF_DBL *j)

{
  printf("%24.15e",*j);
  printf("%24.15e",j[3]);
  printf("%24.15e",j[6]);
  putchar(10);
  printf("%24.15e",j[1]);
  printf("%24.15e",j[4]);
  printf("%24.15e",j[7]);
  putchar(10);
  printf("%24.15e",j[2]);
  printf("%24.15e",j[5]);
  printf("%24.15e",j[8]);
  putchar(10);
  return 0;
}

Assistant:

REF_FCN REF_STATUS ref_matrix_show_jacob(REF_DBL *j) {
  printf("%24.15e", j[0]);
  printf("%24.15e", j[3]);
  printf("%24.15e", j[6]);
  printf("\n");
  printf("%24.15e", j[1]);
  printf("%24.15e", j[4]);
  printf("%24.15e", j[7]);
  printf("\n");
  printf("%24.15e", j[2]);
  printf("%24.15e", j[5]);
  printf("%24.15e", j[8]);
  printf("\n");

  return REF_SUCCESS;
}